

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

cmLinkLineComputer * __thiscall
cmMakefileTargetGenerator::CreateLinkLineComputer
          (cmMakefileTargetGenerator *this,cmOutputConverter *outputConverter,
          cmStateDirectory *stateDir)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_49;
  string local_48;
  cmStateDirectory *local_28;
  cmStateDirectory *stateDir_local;
  cmOutputConverter *outputConverter_local;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_28 = stateDir;
  stateDir_local = (cmStateDirectory *)outputConverter;
  outputConverter_local = (cmOutputConverter *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"MSVC60",&local_49);
  bVar1 = cmMakefile::IsOn(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    this_local = (cmMakefileTargetGenerator *)
                 cmGlobalGenerator::CreateMSVC60LinkLineComputer
                           ((cmGlobalGenerator *)this->GlobalGenerator,
                            (cmOutputConverter *)stateDir_local,local_28);
  }
  else {
    iVar2 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[0xe])(this->GlobalGenerator,stateDir_local,local_28);
    this_local = (cmMakefileTargetGenerator *)CONCAT44(extraout_var,iVar2);
  }
  return (cmLinkLineComputer *)this_local;
}

Assistant:

cmLinkLineComputer* cmMakefileTargetGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter, cmStateDirectory const& stateDir)
{
  if (this->Makefile->IsOn("MSVC60")) {
    return this->GlobalGenerator->CreateMSVC60LinkLineComputer(outputConverter,
                                                               stateDir);
  }
  return this->GlobalGenerator->CreateLinkLineComputer(outputConverter,
                                                       stateDir);
}